

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O1

void __thiscall
PlantUmlGenerator::transitionLink
          (PlantUmlGenerator *this,ostream *output,string *indent,bool isTransitionHighlighted,
          ScName *stateAliasOrigin,ScName *stateAliasTarget,ScNameSet *eventNames)

{
  ostream *poVar1;
  const_iterator cVar2;
  _Rb_tree_node_base *p_Var3;
  undefined7 in_register_00000009;
  long lVar4;
  _Rb_tree_header *p_Var5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> eventName;
  ScName local_70;
  key_type local_50;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,(indent->_M_dataplus)._M_p,indent->_M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(stateAliasOrigin->_M_dataplus)._M_p,stateAliasOrigin->_M_string_length
                     );
  if ((int)CONCAT71(in_register_00000009,isTransitionHighlighted) == 0) {
    pcVar6 = "-->";
    lVar4 = 3;
  }
  else {
    pcVar6 = "-[#red,bold]-->";
    lVar4 = 0xf;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,lVar4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(stateAliasTarget->_M_dataplus)._M_p,stateAliasTarget->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
  p_Var3 = (eventNames->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(eventNames->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      if (local_50._M_string_length == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x11d37f);
      }
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->super_AbstractGenerator).m_highlightSet._M_t,&local_50);
      if ((_Rb_tree_header *)cVar2._M_node ==
          &(this->super_AbstractGenerator).m_highlightSet._M_t._M_impl.super__Rb_tree_header) {
        removeNamespaces(&local_70,&local_50);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\\n",2);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(output,"<b>",3);
        removeNamespaces(&local_70,&local_50);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</b>\\n",6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"\n",1);
  return;
}

Assistant:

void PlantUmlGenerator::transitionLink(std::ostream &output, std::string &indent,
                                       bool isTransitionHighlighted, const ScName &stateAliasOrigin,
                                       const ScName &stateAliasTarget, const ScNameSet &eventNames)
{

    if (isTransitionHighlighted) {
        output << indent << stateAliasOrigin << "-[#red,bold]-->" << stateAliasTarget << " : ";
    } else {
        output << indent << stateAliasOrigin << "-->" << stateAliasTarget << " : ";
    }

    for (auto eventName : eventNames) {
        if (eventName.empty()) {
            eventName = "<unknown>";
        }

        if (isHighlighted(eventName)) {
            output << "<b>" << removeNamespaces(eventName) << "</b>\\n";
        } else {
            output << removeNamespaces(eventName) << "\\n";
        }
    }

    output << "\n";
}